

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_dot_pack4.h
# Opt level: O3

void ncnn::convolution_winograd_dot_pack4_sse
               (Mat *bottom_blob_tm,int outch,Mat *kernel_tm,Mat *top_blob_tm,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint _w;
  uint _c;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  float *pfVar21;
  long lVar22;
  undefined1 (*pauVar23) [16];
  uint uVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  void *pvVar28;
  int iVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  float *pfVar32;
  ulong uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  ulong local_a0;
  undefined1 local_88 [64];
  size_t local_48;
  Mat *local_40;
  ulong local_38;
  
  _w = bottom_blob_tm->w;
  uVar33 = (ulong)(int)_w;
  _c = bottom_blob_tm->h;
  iVar5 = bottom_blob_tm->c;
  local_48 = 0;
  local_88._0_8_ = (Allocator *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_88._24_4_ = 0;
  local_88._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if ((long)uVar33 < 0xc) {
    if ((int)_w < 8) {
      if ((int)_w < 4) {
        iVar29 = iVar5;
        uVar24 = _w;
        if (1 < (int)_w) {
          iVar29 = iVar5 * 2;
          uVar24 = (_w & 1) + 1;
        }
      }
      else {
        iVar29 = iVar5 * 4;
        uVar24 = (_w & 1) + 1 + (uint)((_w >> 1 & 1) != 0);
      }
    }
    else {
      iVar29 = iVar5 * 8;
      uVar24 = (_w & 1) + 1 + (_w >> 2 & 1) + (uint)((_w >> 1 & 1) != 0);
    }
  }
  else {
    uVar24 = _w % 0xc;
    iVar29 = iVar5 * 0xc;
    uVar24 = (uVar24 & 1) + (uVar24 >> 3) + _w / 0xc + (uVar24 >> 2 & 1) +
             (uint)((uVar24 >> 1 & 1) != 0);
  }
  local_88._32_8_ = local_88._0_8_;
  local_88._40_4_ = local_88._8_4_;
  local_88._44_4_ = local_88._12_4_;
  local_40 = kernel_tm;
  Mat::create((Mat *)local_88,iVar29,uVar24,_c,0x10,4,opt->workspace_allocator);
  if (0 < (int)_c) {
    uVar25 = 0;
    do {
      lVar27 = local_48 * uVar25 * local_88._16_8_;
      lVar17 = (long)(int)local_88._44_4_;
      uVar30 = 0;
      if (0xb < (int)_w) {
        uVar30 = 0;
        do {
          iVar29 = (int)uVar30;
          if (0 < iVar5) {
            pauVar31 = (undefined1 (*) [16])
                       ((ulong)((_w * (int)uVar25 + iVar29) * 4) * 4 + (long)bottom_blob_tm->data);
            pauVar23 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (uVar30 / 0xc) * local_88._16_8_ * lVar17 + lVar27);
            iVar15 = iVar5;
            do {
              auVar43 = vunpcklps_avx(*pauVar31,pauVar31[1]);
              auVar54 = vunpcklps_avx(pauVar31[2],pauVar31[3]);
              auVar47 = vunpckhps_avx(*pauVar31,pauVar31[1]);
              auVar51 = vunpckhps_avx(pauVar31[2],pauVar31[3]);
              auVar38 = vmovlhps_avx(auVar43,auVar54);
              auVar60 = vunpckhpd_avx(auVar43,auVar54);
              auVar43 = vmovlhps_avx(auVar47,auVar51);
              auVar63 = vunpckhpd_avx(auVar47,auVar51);
              auVar51 = vunpcklps_avx(pauVar31[4],pauVar31[5]);
              auVar65 = vunpcklps_avx(pauVar31[6],pauVar31[7]);
              auVar54 = vunpckhps_avx(pauVar31[4],pauVar31[5]);
              auVar57 = vunpckhps_avx(pauVar31[6],pauVar31[7]);
              auVar47 = vmovlhps_avx(auVar51,auVar65);
              auVar65 = vunpckhpd_avx(auVar51,auVar65);
              auVar51 = vmovlhps_avx(auVar54,auVar57);
              auVar67 = vunpckhpd_avx(auVar54,auVar57);
              auVar57 = vunpcklps_avx(pauVar31[8],pauVar31[9]);
              auVar69 = vunpcklps_avx(pauVar31[10],pauVar31[0xb]);
              auVar39 = vunpckhps_avx(pauVar31[8],pauVar31[9]);
              auVar44 = vunpckhps_avx(pauVar31[10],pauVar31[0xb]);
              auVar54 = vmovlhps_avx(auVar57,auVar69);
              auVar69 = vunpckhpd_avx(auVar57,auVar69);
              auVar57 = vmovlhps_avx(auVar39,auVar44);
              auVar39 = vunpckhpd_avx(auVar39,auVar44);
              *pauVar23 = auVar38;
              pauVar23[1] = auVar47;
              pauVar23[2] = auVar54;
              pauVar23[3] = auVar60;
              pauVar23[4] = auVar65;
              pauVar23[5] = auVar69;
              pauVar23[6] = auVar43;
              pauVar23[7] = auVar51;
              pauVar23[8] = auVar57;
              pauVar23[9] = auVar63;
              pauVar23[10] = auVar67;
              pauVar23[0xb] = auVar39;
              pauVar31 = pauVar31 + bottom_blob_tm->cstep;
              pauVar23 = pauVar23 + 0xc;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          uVar30 = uVar30 + 0xc;
        } while (iVar29 + 0x17 < (int)_w);
      }
      if ((int)uVar30 + 7 < (int)_w) {
        uVar20 = (long)(int)uVar30;
        do {
          if (0 < iVar5) {
            pauVar23 = (undefined1 (*) [16])
                       ((uVar20 + uVar25 * uVar33) * 0x10 + (long)bottom_blob_tm->data);
            pauVar31 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (ulong)(((uint)((int)uVar20 + (int)((uVar20 & 0xffffffff) / 0xc) * -0xc) >> 3
                               ) + (int)((uVar20 & 0xffffffff) / 0xc)) * local_88._16_8_ * lVar17 +
                       lVar27);
            iVar29 = iVar5;
            do {
              auVar43 = vunpcklps_avx(*pauVar23,pauVar23[1]);
              auVar54 = vunpcklps_avx(pauVar23[2],pauVar23[3]);
              auVar47 = vunpckhps_avx(*pauVar23,pauVar23[1]);
              auVar51 = vunpckhps_avx(pauVar23[2],pauVar23[3]);
              auVar38 = vmovlhps_avx(auVar43,auVar54);
              auVar54 = vunpckhpd_avx(auVar43,auVar54);
              auVar43 = vmovlhps_avx(auVar47,auVar51);
              auVar57 = vunpckhpd_avx(auVar47,auVar51);
              auVar51 = vunpcklps_avx(pauVar23[4],pauVar23[5]);
              auVar60 = vunpcklps_avx(pauVar23[6],pauVar23[7]);
              auVar63 = vunpckhps_avx(pauVar23[4],pauVar23[5]);
              auVar65 = vunpckhps_avx(pauVar23[6],pauVar23[7]);
              auVar47 = vmovlhps_avx(auVar51,auVar60);
              auVar60 = vunpckhpd_avx(auVar51,auVar60);
              auVar51 = vmovlhps_avx(auVar63,auVar65);
              auVar63 = vunpckhpd_avx(auVar63,auVar65);
              *pauVar31 = auVar38;
              pauVar31[1] = auVar47;
              pauVar31[2] = auVar54;
              pauVar31[3] = auVar60;
              pauVar31[4] = auVar43;
              pauVar31[5] = auVar51;
              pauVar31[6] = auVar57;
              pauVar31[7] = auVar63;
              pauVar23 = pauVar23 + bottom_blob_tm->cstep;
              pauVar31 = pauVar31 + 8;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar30 = uVar20 + 8;
          bVar10 = (long)uVar20 < (long)(uVar33 - 0xf);
          uVar20 = uVar30;
        } while (bVar10);
      }
      if ((int)((uint)uVar30 | 3) < (int)_w) {
        uVar20 = (long)(int)(uint)uVar30;
        do {
          if (0 < iVar5) {
            pauVar23 = (undefined1 (*) [16])
                       ((uVar20 + uVar25 * uVar33) * 0x10 + (long)bottom_blob_tm->data);
            uVar24 = (int)uVar20 + (int)((uVar20 & 0xffffffff) / 0xc) * -0xc;
            pauVar31 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (ulong)((uVar24 >> 3) + (int)((uVar20 & 0xffffffff) / 0xc) +
                              (uint)((uVar24 >> 2 & 1) != 0)) * local_88._16_8_ * lVar17 + lVar27);
            iVar29 = iVar5;
            do {
              auVar43 = vunpcklps_avx(*pauVar23,pauVar23[1]);
              auVar47 = vunpcklps_avx(pauVar23[2],pauVar23[3]);
              auVar51 = vunpckhps_avx(*pauVar23,pauVar23[1]);
              auVar54 = vunpckhps_avx(pauVar23[2],pauVar23[3]);
              auVar38 = vmovlhps_avx(auVar43,auVar47);
              auVar47 = vunpckhpd_avx(auVar43,auVar47);
              auVar43 = vmovlhps_avx(auVar51,auVar54);
              auVar51 = vunpckhpd_avx(auVar51,auVar54);
              *pauVar31 = auVar38;
              pauVar31[1] = auVar47;
              pauVar31[2] = auVar43;
              pauVar31[3] = auVar51;
              pauVar23 = pauVar23 + bottom_blob_tm->cstep;
              pauVar31 = pauVar31 + 4;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar30 = uVar20 + 4;
          lVar19 = uVar20 + 7;
          uVar20 = uVar30;
        } while (lVar19 < (long)uVar33);
      }
      if ((int)((uint)uVar30 | 1) < (int)_w) {
        uVar20 = (long)(int)(uint)uVar30;
        do {
          if (0 < iVar5) {
            pauVar23 = (undefined1 (*) [16])
                       ((uVar20 + uVar25 * uVar33) * 0x10 + (long)bottom_blob_tm->data);
            uVar24 = (int)uVar20 + (int)((uVar20 & 0xffffffff) / 0xc) * -0xc;
            pauVar31 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (ulong)((uVar24 >> 2 & 1) +
                               (uVar24 >> 3) + (int)((uVar20 & 0xffffffff) / 0xc) +
                              (uint)((uVar24 >> 1 & 1) != 0)) * local_88._16_8_ * lVar17 + lVar27);
            iVar29 = iVar5;
            do {
              auVar43 = vunpcklps_avx(*pauVar23,pauVar23[1]);
              auVar38 = vunpckhps_avx(*pauVar23,pauVar23[1]);
              *pauVar31 = auVar43;
              pauVar31[1] = auVar38;
              pauVar23 = pauVar23 + bottom_blob_tm->cstep;
              pauVar31 = pauVar31 + 2;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar30 = uVar20 + 2;
          lVar19 = uVar20 + 3;
          uVar20 = uVar30;
        } while (lVar19 < (long)uVar33);
      }
      if ((int)uVar30 < (int)_w) {
        uVar30 = (ulong)(int)uVar30;
        do {
          if (0 < iVar5) {
            pauVar23 = (undefined1 (*) [16])
                       ((uVar30 + uVar25 * uVar33) * 0x10 + (long)bottom_blob_tm->data);
            uVar24 = (int)uVar30 + (int)((uVar30 & 0xffffffff) / 0xc) * -0xc;
            pauVar31 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (ulong)((uVar24 >> 2 & 1) +
                               (uVar24 & 1) + (uVar24 >> 3) + (int)((uVar30 & 0xffffffff) / 0xc) +
                              (uint)((uVar24 >> 1 & 1) != 0)) * local_88._16_8_ * lVar17 + lVar27);
            iVar29 = iVar5;
            do {
              *pauVar31 = *pauVar23;
              pauVar23 = pauVar23 + bottom_blob_tm->cstep;
              pauVar31 = pauVar31 + 1;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar33);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != _c);
  }
  piVar6 = bottom_blob_tm->refcount;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (bottom_blob_tm->allocator == (Allocator *)0x0) {
        if (bottom_blob_tm->data != (void *)0x0) {
          free(bottom_blob_tm->data);
        }
      }
      else {
        (*bottom_blob_tm->allocator->_vptr_Allocator[3])();
      }
    }
  }
  bottom_blob_tm->cstep = 0;
  *(undefined4 *)&bottom_blob_tm->data = 0;
  *(undefined4 *)((long)&bottom_blob_tm->data + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->refcount = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->elemsize = 0;
  *(undefined4 *)((long)&bottom_blob_tm->elemsize + 4) = 0;
  bottom_blob_tm->elempack = 0;
  *(undefined4 *)&bottom_blob_tm->allocator = 0;
  *(undefined4 *)((long)&bottom_blob_tm->allocator + 4) = 0;
  bottom_blob_tm->dims = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->h = 0;
  bottom_blob_tm->d = 0;
  bottom_blob_tm->c = 0;
  Mat::create(top_blob_tm,_w,_c,outch,0x10,4,opt->workspace_allocator);
  if (0 < outch) {
    iVar29 = 1;
    if (1 < iVar5 * 4) {
      iVar29 = iVar5 * 4;
    }
    local_38 = (ulong)(uint)outch;
    local_a0 = 0;
    do {
      if (0 < (int)_c) {
        sVar7 = local_40->cstep;
        pvVar8 = local_40->data;
        sVar9 = local_40->elemsize;
        lVar17 = (long)local_40->w * sVar9;
        pauVar23 = (undefined1 (*) [16])
                   (top_blob_tm->cstep * local_a0 * top_blob_tm->elemsize + (long)top_blob_tm->data)
        ;
        pvVar28 = (void *)(sVar7 * sVar9 * local_a0 + (long)pvVar8);
        uVar33 = 0;
        do {
          lVar27 = local_48 * uVar33;
          uVar25 = 0;
          lVar19 = (long)(int)local_88._44_4_;
          if (0xb < (int)_w) {
            uVar30 = 0;
            do {
              if (iVar5 < 1) {
                auVar38 = SUB6416(ZEXT864(0),0);
                fVar34 = 0.0;
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
                auVar43 = SUB6416(ZEXT864(0),0);
                auVar47 = SUB6416(ZEXT864(0),0);
                auVar51 = SUB6416(ZEXT864(0),0);
                auVar54 = SUB6416(ZEXT864(0),0);
                auVar57 = SUB6416(ZEXT864(0),0);
                auVar63 = SUB6416(ZEXT864(0),0);
                auVar65 = SUB6416(ZEXT864(0),0);
                auVar67 = SUB6416(ZEXT864(0),0);
                auVar69 = SUB6416(ZEXT864(0),0);
                auVar60 = SUB6416(ZEXT864(0),0);
              }
              else {
                pfVar21 = (float *)((long)(_func_int ***)local_88._0_8_ +
                                   (uVar30 / 0xc) * local_88._16_8_ * lVar19 +
                                   lVar27 * local_88._16_8_);
                auVar62 = ZEXT864(0);
                auVar70 = ZEXT864(0);
                auVar68 = ZEXT864(0);
                auVar66 = ZEXT864(0);
                auVar64 = ZEXT864(0);
                auVar59 = ZEXT864(0);
                auVar56 = ZEXT864(0);
                auVar53 = ZEXT864(0);
                auVar50 = ZEXT864(0);
                auVar46 = ZEXT864(0);
                fVar34 = 0.0;
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
                auVar42 = ZEXT864(0);
                pfVar32 = (float *)((long)pvVar8 + lVar17 * uVar33 + sVar7 * local_a0 * sVar9);
                iVar15 = iVar29;
                do {
                  fVar2 = *pfVar32;
                  fVar3 = pfVar32[1];
                  fVar4 = pfVar32[2];
                  fVar11 = pfVar32[3];
                  fVar1 = *pfVar21;
                  auVar60._0_4_ = fVar1 * fVar2 + auVar62._0_4_;
                  auVar60._4_4_ = fVar1 * fVar3 + auVar62._4_4_;
                  auVar60._8_4_ = fVar1 * fVar4 + auVar62._8_4_;
                  auVar60._12_4_ = fVar1 * fVar11 + auVar62._12_4_;
                  auVar62 = ZEXT1664(auVar60);
                  fVar1 = pfVar21[1];
                  auVar69._0_4_ = fVar1 * fVar2 + auVar70._0_4_;
                  auVar69._4_4_ = fVar1 * fVar3 + auVar70._4_4_;
                  auVar69._8_4_ = fVar1 * fVar4 + auVar70._8_4_;
                  auVar69._12_4_ = fVar1 * fVar11 + auVar70._12_4_;
                  auVar70 = ZEXT1664(auVar69);
                  fVar1 = pfVar21[2];
                  auVar67._0_4_ = fVar1 * fVar2 + auVar68._0_4_;
                  auVar67._4_4_ = fVar1 * fVar3 + auVar68._4_4_;
                  auVar67._8_4_ = fVar1 * fVar4 + auVar68._8_4_;
                  auVar67._12_4_ = fVar1 * fVar11 + auVar68._12_4_;
                  auVar68 = ZEXT1664(auVar67);
                  fVar1 = pfVar21[3];
                  auVar65._0_4_ = fVar1 * fVar2 + auVar66._0_4_;
                  auVar65._4_4_ = fVar1 * fVar3 + auVar66._4_4_;
                  auVar65._8_4_ = fVar1 * fVar4 + auVar66._8_4_;
                  auVar65._12_4_ = fVar1 * fVar11 + auVar66._12_4_;
                  auVar66 = ZEXT1664(auVar65);
                  fVar1 = pfVar21[4];
                  auVar63._0_4_ = fVar1 * fVar2 + auVar64._0_4_;
                  auVar63._4_4_ = fVar1 * fVar3 + auVar64._4_4_;
                  auVar63._8_4_ = fVar1 * fVar4 + auVar64._8_4_;
                  auVar63._12_4_ = fVar1 * fVar11 + auVar64._12_4_;
                  auVar64 = ZEXT1664(auVar63);
                  fVar1 = pfVar21[5];
                  auVar57._0_4_ = fVar1 * fVar2 + auVar59._0_4_;
                  auVar57._4_4_ = fVar1 * fVar3 + auVar59._4_4_;
                  auVar57._8_4_ = fVar1 * fVar4 + auVar59._8_4_;
                  auVar57._12_4_ = fVar1 * fVar11 + auVar59._12_4_;
                  auVar59 = ZEXT1664(auVar57);
                  fVar1 = pfVar21[6];
                  auVar54._0_4_ = fVar1 * fVar2 + auVar56._0_4_;
                  auVar54._4_4_ = fVar1 * fVar3 + auVar56._4_4_;
                  auVar54._8_4_ = fVar1 * fVar4 + auVar56._8_4_;
                  auVar54._12_4_ = fVar1 * fVar11 + auVar56._12_4_;
                  auVar56 = ZEXT1664(auVar54);
                  fVar1 = pfVar21[7];
                  auVar51._0_4_ = fVar1 * fVar2 + auVar53._0_4_;
                  auVar51._4_4_ = fVar1 * fVar3 + auVar53._4_4_;
                  auVar51._8_4_ = fVar1 * fVar4 + auVar53._8_4_;
                  auVar51._12_4_ = fVar1 * fVar11 + auVar53._12_4_;
                  auVar53 = ZEXT1664(auVar51);
                  fVar1 = pfVar21[8];
                  auVar47._0_4_ = fVar1 * fVar2 + auVar50._0_4_;
                  auVar47._4_4_ = fVar1 * fVar3 + auVar50._4_4_;
                  auVar47._8_4_ = fVar1 * fVar4 + auVar50._8_4_;
                  auVar47._12_4_ = fVar1 * fVar11 + auVar50._12_4_;
                  auVar50 = ZEXT1664(auVar47);
                  fVar1 = pfVar21[9];
                  auVar43._0_4_ = fVar1 * fVar2 + auVar46._0_4_;
                  auVar43._4_4_ = fVar1 * fVar3 + auVar46._4_4_;
                  auVar43._8_4_ = fVar1 * fVar4 + auVar46._8_4_;
                  auVar43._12_4_ = fVar1 * fVar11 + auVar46._12_4_;
                  auVar46 = ZEXT1664(auVar43);
                  fVar1 = pfVar21[10];
                  auVar38._0_4_ = fVar1 * fVar2 + auVar42._0_4_;
                  auVar38._4_4_ = fVar1 * fVar3 + auVar42._4_4_;
                  auVar38._8_4_ = fVar1 * fVar4 + auVar42._8_4_;
                  auVar38._12_4_ = fVar1 * fVar11 + auVar42._12_4_;
                  auVar42 = ZEXT1664(auVar38);
                  fVar1 = pfVar21[0xb];
                  fVar34 = fVar1 * fVar2 + fVar34;
                  fVar35 = fVar1 * fVar3 + fVar35;
                  fVar36 = fVar1 * fVar4 + fVar36;
                  fVar37 = fVar1 * fVar11 + fVar37;
                  pfVar21 = pfVar21 + 0xc;
                  pfVar32 = pfVar32 + 4;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              *pauVar23 = auVar60;
              pauVar23[1] = auVar69;
              pauVar23[2] = auVar67;
              pauVar23[3] = auVar65;
              pauVar23[4] = auVar63;
              pauVar23[5] = auVar57;
              pauVar23[6] = auVar54;
              pauVar23[7] = auVar51;
              pauVar23[8] = auVar47;
              pauVar23[9] = auVar43;
              pauVar23[10] = auVar38;
              *(float *)pauVar23[0xb] = fVar34;
              *(float *)(pauVar23[0xb] + 4) = fVar35;
              *(float *)(pauVar23[0xb] + 8) = fVar36;
              *(float *)(pauVar23[0xb] + 0xc) = fVar37;
              pauVar23 = pauVar23 + 0xc;
              uVar25 = uVar30 + 0xc;
              iVar15 = (int)uVar30;
              uVar30 = uVar25;
            } while (iVar15 + 0x17 < (int)_w);
          }
          uVar24 = (uint)uVar25;
          for (iVar15 = uVar24 + 7; iVar15 < (int)_w; iVar15 = iVar15 + 0xf) {
            iVar15 = (int)uVar25;
            if (iVar5 < 1) {
              auVar61 = SUB6416(ZEXT864(0),0);
              auVar58 = SUB6416(ZEXT864(0),0);
              auVar55 = SUB6416(ZEXT864(0),0);
              auVar52 = SUB6416(ZEXT864(0),0);
              auVar48 = SUB6416(ZEXT864(0),0);
              auVar44 = SUB6416(ZEXT864(0),0);
              auVar39 = SUB6416(ZEXT864(0),0);
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
            }
            else {
              lVar18 = ((ulong)(((uint)(iVar15 + (int)((uVar25 & 0xffffffff) / 0xc) * -0xc) >> 3) +
                               (int)((uVar25 & 0xffffffff) / 0xc)) * lVar19 + lVar27) *
                       local_88._16_8_;
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              lVar22 = 0;
              auVar42 = ZEXT864(0);
              auVar46 = ZEXT864(0);
              auVar50 = ZEXT864(0);
              auVar53 = ZEXT864(0);
              auVar56 = ZEXT864(0);
              auVar59 = ZEXT864(0);
              auVar62 = ZEXT864(0);
              iVar26 = iVar29;
              do {
                pfVar32 = (float *)((long)pvVar28 + lVar22);
                fVar2 = *pfVar32;
                fVar3 = pfVar32[1];
                fVar4 = pfVar32[2];
                fVar11 = pfVar32[3];
                fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar22 * 2 + lVar18);
                auVar61._0_4_ = fVar1 * fVar2 + auVar62._0_4_;
                auVar61._4_4_ = fVar1 * fVar3 + auVar62._4_4_;
                auVar61._8_4_ = fVar1 * fVar4 + auVar62._8_4_;
                auVar61._12_4_ = fVar1 * fVar11 + auVar62._12_4_;
                auVar62 = ZEXT1664(auVar61);
                fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar22 * 2 + lVar18 + 4);
                auVar58._0_4_ = fVar1 * fVar2 + auVar59._0_4_;
                auVar58._4_4_ = fVar1 * fVar3 + auVar59._4_4_;
                auVar58._8_4_ = fVar1 * fVar4 + auVar59._8_4_;
                auVar58._12_4_ = fVar1 * fVar11 + auVar59._12_4_;
                auVar59 = ZEXT1664(auVar58);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 8))->_vptr_Allocator +
                                  lVar22 * 2 + lVar18);
                auVar55._0_4_ = fVar1 * fVar2 + auVar56._0_4_;
                auVar55._4_4_ = fVar1 * fVar3 + auVar56._4_4_;
                auVar55._8_4_ = fVar1 * fVar4 + auVar56._8_4_;
                auVar55._12_4_ = fVar1 * fVar11 + auVar56._12_4_;
                auVar56 = ZEXT1664(auVar55);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 8))->_vptr_Allocator +
                                  lVar22 * 2 + lVar18 + 4);
                auVar52._0_4_ = fVar1 * fVar2 + auVar53._0_4_;
                auVar52._4_4_ = fVar1 * fVar3 + auVar53._4_4_;
                auVar52._8_4_ = fVar1 * fVar4 + auVar53._8_4_;
                auVar52._12_4_ = fVar1 * fVar11 + auVar53._12_4_;
                auVar53 = ZEXT1664(auVar52);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 0x10))->_vptr_Allocator +
                                  lVar22 * 2 + lVar18);
                auVar48._0_4_ = fVar1 * fVar2 + auVar50._0_4_;
                auVar48._4_4_ = fVar1 * fVar3 + auVar50._4_4_;
                auVar48._8_4_ = fVar1 * fVar4 + auVar50._8_4_;
                auVar48._12_4_ = fVar1 * fVar11 + auVar50._12_4_;
                auVar50 = ZEXT1664(auVar48);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 0x10))->_vptr_Allocator +
                                  lVar22 * 2 + lVar18 + 4);
                auVar44._0_4_ = fVar1 * fVar2 + auVar46._0_4_;
                auVar44._4_4_ = fVar1 * fVar3 + auVar46._4_4_;
                auVar44._8_4_ = fVar1 * fVar4 + auVar46._8_4_;
                auVar44._12_4_ = fVar1 * fVar11 + auVar46._12_4_;
                auVar46 = ZEXT1664(auVar44);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 0x18))->_vptr_Allocator +
                                  lVar22 * 2 + lVar18);
                auVar39._0_4_ = fVar1 * fVar2 + auVar42._0_4_;
                auVar39._4_4_ = fVar1 * fVar3 + auVar42._4_4_;
                auVar39._8_4_ = fVar1 * fVar4 + auVar42._8_4_;
                auVar39._12_4_ = fVar1 * fVar11 + auVar42._12_4_;
                auVar42 = ZEXT1664(auVar39);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 0x18))->_vptr_Allocator +
                                  lVar22 * 2 + lVar18 + 4);
                fVar34 = fVar1 * fVar2 + fVar34;
                fVar35 = fVar1 * fVar3 + fVar35;
                fVar36 = fVar1 * fVar4 + fVar36;
                fVar37 = fVar1 * fVar11 + fVar37;
                lVar22 = lVar22 + 0x10;
                iVar26 = iVar26 + -1;
              } while (iVar26 != 0);
            }
            *pauVar23 = auVar61;
            pauVar23[1] = auVar58;
            pauVar23[2] = auVar55;
            pauVar23[3] = auVar52;
            pauVar23[4] = auVar48;
            pauVar23[5] = auVar44;
            pauVar23[6] = auVar39;
            *(float *)pauVar23[7] = fVar34;
            *(float *)(pauVar23[7] + 4) = fVar35;
            *(float *)(pauVar23[7] + 8) = fVar36;
            *(float *)(pauVar23[7] + 0xc) = fVar37;
            pauVar23 = pauVar23 + 8;
            uVar24 = iVar15 + 8;
            uVar25 = (ulong)uVar24;
          }
          uVar16 = uVar24 | 3;
          while ((int)uVar16 < (int)_w) {
            if (iVar5 < 1) {
              auVar49 = SUB6416(ZEXT864(0),0);
              auVar45 = SUB6416(ZEXT864(0),0);
              auVar40 = SUB6416(ZEXT864(0),0);
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
            }
            else {
              lVar18 = ((ulong)((uVar24 % 0xc >> 3) + uVar24 / 0xc +
                               (uint)((uVar24 % 0xc >> 2 & 1) != 0)) * lVar19 + lVar27) *
                       local_88._16_8_;
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              lVar22 = 0;
              auVar42 = ZEXT864(0);
              auVar46 = ZEXT864(0);
              auVar50 = ZEXT864(0);
              iVar15 = iVar29;
              do {
                pfVar32 = (float *)((long)pvVar28 + lVar22);
                fVar11 = *pfVar32;
                fVar12 = pfVar32[1];
                fVar13 = pfVar32[2];
                fVar14 = pfVar32[3];
                fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar22 + lVar18);
                fVar2 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar22 + lVar18 + 4);
                fVar3 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 8))->_vptr_Allocator +
                                  lVar22 + lVar18);
                fVar4 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 8))->_vptr_Allocator +
                                  lVar22 + lVar18 + 4);
                auVar49._0_4_ = fVar1 * fVar11 + auVar50._0_4_;
                auVar49._4_4_ = fVar1 * fVar12 + auVar50._4_4_;
                auVar49._8_4_ = fVar1 * fVar13 + auVar50._8_4_;
                auVar49._12_4_ = fVar1 * fVar14 + auVar50._12_4_;
                auVar50 = ZEXT1664(auVar49);
                auVar45._0_4_ = fVar2 * fVar11 + auVar46._0_4_;
                auVar45._4_4_ = fVar2 * fVar12 + auVar46._4_4_;
                auVar45._8_4_ = fVar2 * fVar13 + auVar46._8_4_;
                auVar45._12_4_ = fVar2 * fVar14 + auVar46._12_4_;
                auVar46 = ZEXT1664(auVar45);
                auVar40._0_4_ = fVar3 * fVar11 + auVar42._0_4_;
                auVar40._4_4_ = fVar3 * fVar12 + auVar42._4_4_;
                auVar40._8_4_ = fVar3 * fVar13 + auVar42._8_4_;
                auVar40._12_4_ = fVar3 * fVar14 + auVar42._12_4_;
                auVar42 = ZEXT1664(auVar40);
                fVar34 = fVar4 * fVar11 + fVar34;
                fVar35 = fVar4 * fVar12 + fVar35;
                fVar36 = fVar4 * fVar13 + fVar36;
                fVar37 = fVar4 * fVar14 + fVar37;
                lVar22 = lVar22 + 0x10;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
            *pauVar23 = auVar49;
            pauVar23[1] = auVar45;
            pauVar23[2] = auVar40;
            *(float *)pauVar23[3] = fVar34;
            *(float *)(pauVar23[3] + 4) = fVar35;
            *(float *)(pauVar23[3] + 8) = fVar36;
            *(float *)(pauVar23[3] + 0xc) = fVar37;
            pauVar23 = pauVar23 + 4;
            uVar16 = uVar24 + 7;
            uVar24 = uVar24 + 4;
          }
          uVar16 = uVar24 | 1;
          while ((int)uVar16 < (int)_w) {
            uVar16 = uVar24 % 0xc;
            if (iVar5 < 1) {
              auVar41 = SUB6416(ZEXT864(0),0);
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
            }
            else {
              lVar18 = ((ulong)((uVar16 >> 2 & 1) + (uVar16 >> 3) + uVar24 / 0xc +
                               (uint)((uVar16 >> 1 & 1) != 0)) * lVar19 + lVar27) * local_88._16_8_;
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              lVar22 = 0;
              auVar42 = ZEXT864(0);
              iVar15 = iVar29;
              do {
                pfVar32 = (float *)((long)pvVar28 + lVar22 * 2);
                fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar22 + lVar18);
                fVar2 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar22 + lVar18 + 4);
                auVar41._0_4_ = fVar1 * *pfVar32 + auVar42._0_4_;
                auVar41._4_4_ = fVar1 * pfVar32[1] + auVar42._4_4_;
                auVar41._8_4_ = fVar1 * pfVar32[2] + auVar42._8_4_;
                auVar41._12_4_ = fVar1 * pfVar32[3] + auVar42._12_4_;
                auVar42 = ZEXT1664(auVar41);
                fVar34 = fVar2 * *pfVar32 + fVar34;
                fVar35 = fVar2 * pfVar32[1] + fVar35;
                fVar36 = fVar2 * pfVar32[2] + fVar36;
                fVar37 = fVar2 * pfVar32[3] + fVar37;
                lVar22 = lVar22 + 8;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
            *pauVar23 = auVar41;
            *(float *)pauVar23[1] = fVar34;
            *(float *)(pauVar23[1] + 4) = fVar35;
            *(float *)(pauVar23[1] + 8) = fVar36;
            *(float *)(pauVar23[1] + 0xc) = fVar37;
            pauVar23 = pauVar23 + 2;
            uVar16 = uVar24 + 3;
            uVar24 = uVar24 + 2;
          }
          if ((int)uVar24 < (int)_w) {
            do {
              uVar16 = uVar24 % 0xc;
              if (iVar5 < 1) {
                fVar34 = 0.0;
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
              }
              else {
                fVar34 = 0.0;
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
                lVar18 = 0;
                iVar15 = iVar29;
                do {
                  fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ +
                                    lVar18 + ((ulong)((uVar16 >> 2 & 1) +
                                                      (uVar24 & 1) + uVar24 / 0xc + (uVar16 >> 3) +
                                                     (uint)((uVar16 >> 1 & 1) != 0)) * lVar19 +
                                             lVar27) * local_88._16_8_);
                  pfVar32 = (float *)((long)pvVar28 + lVar18 * 4);
                  fVar34 = fVar1 * *pfVar32 + fVar34;
                  fVar35 = fVar1 * pfVar32[1] + fVar35;
                  fVar36 = fVar1 * pfVar32[2] + fVar36;
                  fVar37 = fVar1 * pfVar32[3] + fVar37;
                  lVar18 = lVar18 + 4;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              *(float *)*pauVar23 = fVar34;
              *(float *)((long)*pauVar23 + 4) = fVar35;
              *(float *)((long)*pauVar23 + 8) = fVar36;
              *(float *)((long)*pauVar23 + 0xc) = fVar37;
              pauVar23 = pauVar23 + 1;
              uVar24 = uVar24 + 1;
            } while (uVar24 != _w);
          }
          uVar33 = uVar33 + 1;
          pvVar28 = (void *)((long)pvVar28 + lVar17);
        } while (uVar33 != _c);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 != local_38);
  }
  piVar6 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_88._0_8_ != (Allocator *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_winograd_dot_pack4_sse(Mat& bottom_blob_tm, int outch, const Mat& kernel_tm, Mat& top_blob_tm, const Option& opt)
{
    // Mat bottom_blob_tm(tiles, 16/36/64, inch, 16u, 4, opt.workspace_allocator);

    const int tiles = bottom_blob_tm.w;
    const int batch = bottom_blob_tm.h;
    const int inch = bottom_blob_tm.c;

    // permute
    Mat bottom_blob_tm2;
    if (tiles >= 12)
        bottom_blob_tm2.create(12 * inch, tiles / 12 + (tiles % 12) / 8 + (tiles % 12 % 8) / 4 + (tiles % 12 % 4) / 2 + tiles % 12 % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 8)
        bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + (tiles % 4) / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 4)
        bottom_blob_tm2.create(4 * inch, tiles / 4 + (tiles % 4) / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 2)
        bottom_blob_tm2.create(2 * inch, tiles / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else // if (tiles >= 1)
        bottom_blob_tm2.create(1 * inch, tiles, batch, 16u, 4, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int r = 0; r < batch; r++)
    {
        Mat tm2 = bottom_blob_tm2.channel(r);

        // tile
        int i = 0;
        for (; i + 11 < tiles; i += 12)
        {
            float* tmpptr = tm2.row(i / 12);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x12
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(r0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(r0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(r0 + 4 * 9);
                __m128 _ra = _mm_load_ps(r0 + 4 * 10);
                __m128 _rb = _mm_load_ps(r0 + 4 * 11);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r4);
                _mm_store_ps(tmpptr + 4 * 2, _r8);
                _mm_store_ps(tmpptr + 4 * 3, _r1);
                _mm_store_ps(tmpptr + 4 * 4, _r5);
                _mm_store_ps(tmpptr + 4 * 5, _r9);
                _mm_store_ps(tmpptr + 4 * 6, _r2);
                _mm_store_ps(tmpptr + 4 * 7, _r6);
                _mm_store_ps(tmpptr + 4 * 8, _ra);
                _mm_store_ps(tmpptr + 4 * 9, _r3);
                _mm_store_ps(tmpptr + 4 * 10, _r7);
                _mm_store_ps(tmpptr + 4 * 11, _rb);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 48;
            }
        }
        for (; i + 7 < tiles; i += 8)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x8
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(r0 + 4 * 7);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r4);
                _mm_store_ps(tmpptr + 4 * 2, _r1);
                _mm_store_ps(tmpptr + 4 * 3, _r5);
                _mm_store_ps(tmpptr + 4 * 4, _r2);
                _mm_store_ps(tmpptr + 4 * 5, _r6);
                _mm_store_ps(tmpptr + 4 * 6, _r3);
                _mm_store_ps(tmpptr + 4 * 7, _r7);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 32;
            }
        }
        for (; i + 3 < tiles; i += 4)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x4
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r1);
                _mm_store_ps(tmpptr + 4 * 2, _r2);
                _mm_store_ps(tmpptr + 4 * 3, _r3);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 16;
            }
        }
        for (; i + 1 < tiles; i += 2)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x2
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);

                __m128 _r01_0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _r01_1 = _mm_unpackhi_ps(_r0, _r1);

                _mm_store_ps(tmpptr, _r01_0);
                _mm_store_ps(tmpptr + 4, _r01_1);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 8;
            }
        }
        for (; i < tiles; i++)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                __m128 _val = _mm_load_ps(r0);
                _mm_store_ps(tmpptr, _val);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 4;
            }
        }
    }

    bottom_blob_tm = Mat();
    // permute end

    top_blob_tm.create(tiles, batch, outch, 16u, 4, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* output0_tm = top_blob_tm.channel(p);

        const Mat kernel0_tm = kernel_tm.channel(p);

        for (int r = 0; r < batch; r++)
        {
            const Mat bb2 = bottom_blob_tm2.channel(r);

            int i = 0;
            for (; i + 11 < tiles; i += 12)
            {
                const float* r0 = bb2.row(i / 12);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();
                __m128 _sum4 = _mm_setzero_ps();
                __m128 _sum5 = _mm_setzero_ps();
                __m128 _sum6 = _mm_setzero_ps();
                __m128 _sum7 = _mm_setzero_ps();
                __m128 _sum8 = _mm_setzero_ps();
                __m128 _sum9 = _mm_setzero_ps();
                __m128 _suma = _mm_setzero_ps();
                __m128 _sumb = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);
                    __m128 _val4 = _mm_load1_ps(r0 + 4);
                    __m128 _val5 = _mm_load1_ps(r0 + 5);
                    __m128 _val6 = _mm_load1_ps(r0 + 6);
                    __m128 _val7 = _mm_load1_ps(r0 + 7);
                    __m128 _val8 = _mm_load1_ps(r0 + 8);
                    __m128 _val9 = _mm_load1_ps(r0 + 9);
                    __m128 _vala = _mm_load1_ps(r0 + 10);
                    __m128 _valb = _mm_load1_ps(r0 + 11);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                    _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                    _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);
                    _sum8 = _mm_comp_fmadd_ps(_val8, _w0, _sum8);
                    _sum9 = _mm_comp_fmadd_ps(_val9, _w0, _sum9);
                    _suma = _mm_comp_fmadd_ps(_vala, _w0, _suma);
                    _sumb = _mm_comp_fmadd_ps(_valb, _w0, _sumb);

                    r0 += 12;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);
                _mm_store_ps(output0_tm + 4 * 4, _sum4);
                _mm_store_ps(output0_tm + 4 * 5, _sum5);
                _mm_store_ps(output0_tm + 4 * 6, _sum6);
                _mm_store_ps(output0_tm + 4 * 7, _sum7);
                _mm_store_ps(output0_tm + 4 * 8, _sum8);
                _mm_store_ps(output0_tm + 4 * 9, _sum9);
                _mm_store_ps(output0_tm + 4 * 10, _suma);
                _mm_store_ps(output0_tm + 4 * 11, _sumb);

                output0_tm += 4 * 12;
            }
            for (; i + 7 < tiles; i += 8)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();
                __m128 _sum4 = _mm_setzero_ps();
                __m128 _sum5 = _mm_setzero_ps();
                __m128 _sum6 = _mm_setzero_ps();
                __m128 _sum7 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);
                    __m128 _val4 = _mm_load1_ps(r0 + 4);
                    __m128 _val5 = _mm_load1_ps(r0 + 5);
                    __m128 _val6 = _mm_load1_ps(r0 + 6);
                    __m128 _val7 = _mm_load1_ps(r0 + 7);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                    _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                    _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                    r0 += 8;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);
                _mm_store_ps(output0_tm + 4 * 4, _sum4);
                _mm_store_ps(output0_tm + 4 * 5, _sum5);
                _mm_store_ps(output0_tm + 4 * 6, _sum6);
                _mm_store_ps(output0_tm + 4 * 7, _sum7);

                output0_tm += 4 * 8;
            }
            for (; i + 3 < tiles; i += 4)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                    r0 += 4;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);

                output0_tm += 4 * 4;
            }
            for (; i + 1 < tiles; i += 2)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);

                    r0 += 2;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);

                output0_tm += 4 * 2;
            }
            for (; i < tiles; i++)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);
                    __m128 _val0 = _mm_load1_ps(r0);
                    _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                    r0 += 1;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum);

                output0_tm += 4;
            }
        }
    }
}